

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

Clause * Clasp::SatPreprocessor::Clause::newClause(Literal *lits,uint32 size)

{
  Clause *pCVar1;
  uint32 in_ESI;
  Literal *in_RDI;
  Clause *unaff_retaddr;
  void *mem;
  
  pCVar1 = (Clause *)operator_new((ulong)(in_ESI - 1) * 4 + 0x10);
  Clause(unaff_retaddr,in_RDI,in_ESI);
  return pCVar1;
}

Assistant:

SatPreprocessor::Clause* SatPreprocessor::Clause::newClause(const Literal* lits, uint32 size) {
	assert(size > 0);
	void* mem = ::operator new( sizeof(Clause) + (size-1)*sizeof(Literal) );
	return new (mem) Clause(lits, size);
}